

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O1

uint __thiscall asl::Var::operator_cast_to_unsigned_int(Var *this)

{
  uint uVar1;
  
  uVar1 = 0;
  switch(this->_type) {
  case NUMBER:
  case FLOAT:
    uVar1 = (uint)(long)(this->field_1)._d;
    break;
  case INT:
    return (this->field_1)._i;
  case SSTRING:
    uVar1 = atoi((this->field_1)._ss);
    return uVar1;
  case STRING:
    uVar1 = atoi((char *)this->field_1);
    return uVar1;
  }
  return uVar1;
}

Assistant:

Var::operator unsigned() const
{
	switch(_type) {
	case INT:
		return (unsigned)_i;
	case NUMBER:
	case FLOAT:
		return (unsigned)_d;
	case STRING:
		return (unsigned)atoi(_s->data());
	case SSTRING:
		return (unsigned)atoi(_ss);
	default: break;
	}
	return 0;
}